

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_60e82::TargetTask::start(TargetTask *this,TaskInterface ti)

{
  bool bVar1;
  vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *pvVar2;
  reference ppNVar3;
  BuildKey local_78;
  KeyType local_58;
  __normal_iterator<llbuild::buildsystem::Node_**,_std::vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>_>
  local_38;
  iterator ie;
  iterator it;
  uint id;
  TargetTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (TargetTask *)ti.impl;
  it._M_current._4_4_ = 0;
  pvVar2 = llbuild::buildsystem::Target::getNodes(this->target);
  ie = std::vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>::
       begin(pvVar2);
  pvVar2 = llbuild::buildsystem::Target::getNodes(this->target);
  local_38._M_current =
       (Node **)std::
                vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                ::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&ie,&local_38);
    if (!bVar1) break;
    ppNVar3 = __gnu_cxx::
              __normal_iterator<llbuild::buildsystem::Node_**,_std::vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>_>
              ::operator*(&ie);
    llbuild::buildsystem::BuildKey::makeNode(&local_78,*ppNVar3);
    llbuild::buildsystem::BuildKey::toData(&local_58,&local_78);
    llbuild::core::TaskInterface::request
              ((TaskInterface *)&this_local,&local_58,(ulong)it._M_current._4_4_);
    llbuild::core::KeyType::~KeyType(&local_58);
    llbuild::buildsystem::BuildKey::~BuildKey(&local_78);
    __gnu_cxx::
    __normal_iterator<llbuild::buildsystem::Node_**,_std::vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>_>
    ::operator++(&ie);
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Request all of the necessary system tasks.
    unsigned id = 0;
    for (auto it = target.getNodes().begin(),
           ie = target.getNodes().end(); it != ie; ++it, ++id) {
      ti.request(BuildKey::makeNode(*it).toData(), id);
    }
  }